

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O0

void * X509V3_EXT_d2i(X509_EXTENSION *ext)

{
  void *ret;
  uchar *p;
  X509V3_EXT_METHOD *method;
  X509_EXTENSION *ext_local;
  
  method = (X509V3_EXT_METHOD *)ext;
  p = (uchar *)X509V3_EXT_get(ext);
  if ((X509V3_EXT_METHOD *)p == (X509V3_EXT_METHOD *)0x0) {
    ext_local = (X509_EXTENSION *)0x0;
  }
  else {
    ret = *(void **)(method->ext_new + 8);
    ext_local = (X509_EXTENSION *)
                ASN1_item_d2i((ASN1_VALUE **)0x0,(uchar **)&ret,(long)*(int *)method->ext_new,
                              ((X509V3_EXT_METHOD *)p)->it);
    if (ext_local == (X509_EXTENSION *)0x0) {
      ext_local = (X509_EXTENSION *)0x0;
    }
    else if (ret != (void *)(*(long *)(method->ext_new + 8) + (long)*(int *)method->ext_new)) {
      ASN1_item_free((ASN1_VALUE *)ext_local,*(ASN1_ITEM **)(p + 8));
      ERR_put_error(0x14,0,0xa4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_lib.cc"
                    ,0x98);
      ext_local = (X509_EXTENSION *)0x0;
    }
  }
  return ext_local;
}

Assistant:

void *X509V3_EXT_d2i(const X509_EXTENSION *ext) {
  const X509V3_EXT_METHOD *method;
  const unsigned char *p;

  if (!(method = X509V3_EXT_get(ext))) {
    return NULL;
  }
  p = ext->value->data;
  void *ret =
      ASN1_item_d2i(NULL, &p, ext->value->length, ASN1_ITEM_ptr(method->it));
  if (ret == NULL) {
    return NULL;
  }
  // Check for trailing data.
  if (p != ext->value->data + ext->value->length) {
    ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ret),
                   ASN1_ITEM_ptr(method->it));
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_TRAILING_DATA_IN_EXTENSION);
    return NULL;
  }
  return ret;
}